

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  basic_appender<char> bVar2;
  ulong uVar3;
  undefined8 uVar4;
  int **ppiVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  int num_zeros;
  undefined1 local_ce [2];
  bool local_cc [4];
  int local_c8;
  undefined1 local_c4 [12];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  undefined1 *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c4._0_4_ = f->significand;
  uVar10 = 0x1f;
  if ((local_c4._0_4_ | 1) != 0) {
    for (; (local_c4._0_4_ | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  local_c8 = (int)((ulong)(uint)local_c4._0_4_ +
                   *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar10 * 8) >> 0x20);
  uVar3 = (ulong)((local_c8 + 1) - (uint)(s == none));
  local_ce[1] = '0';
  local_ce[0] = '.';
  local_c4._4_4_ = s;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    local_ce[0] = decimal_point_impl<char>(loc);
  }
  uVar4 = local_a8._M_allocated_capacity;
  uVar10 = f->exponent;
  local_c4._8_4_ = local_c8 + uVar10;
  uVar1 = (specs->super_basic_specs).data_;
  iVar11 = specs->precision;
  bVar7 = (byte)uVar1 & 7;
  if (bVar7 != 1) {
    if ((uVar1 & 7) == 2) {
LAB_003b2d37:
      if ((int)uVar10 < 0) {
        if ((int)local_c4._8_4_ < 1) {
          local_70._M_allocated_capacity._0_4_ = -local_c4._8_4_;
          if ((local_c8 == 0) &&
             (SBORROW4(iVar11,-local_c4._8_4_) != iVar11 + local_c4._8_4_ < 0 && -1 < iVar11)) {
            local_70._M_allocated_capacity._0_4_ = iVar11;
          }
          uVar10 = 1;
          if (local_c8 == 0 && local_70._0_4_ == 0) {
            uVar10 = uVar1 >> 0xd & 1;
          }
          local_b8._8_8_ = local_cc;
          local_cc[0] = (bool)(char)uVar10;
          sVar13 = uVar3 + (local_70._0_4_ + uVar10 + 1);
          local_b8._0_8_ = local_c4 + 4;
          local_a8._M_allocated_capacity = (size_type)local_ce;
          local_a8._8_8_ = &local_70;
          local_98._M_p = local_ce + 1;
          local_90 = (format_specs *)local_c4;
          local_88._M_allocated_capacity = (size_type)&local_c8;
          bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_88befd79 *)local_b8);
          return (basic_appender<char>)bVar2.container;
        }
        iVar6 = 0;
        local_cc = (bool  [4])(iVar11 - local_c8 & (int)(uVar1 << 0x12) >> 0x1f);
        uVar10 = (uint)local_cc;
        if ((int)local_cc < 1) {
          uVar10 = 0;
        }
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        sVar13 = uVar10 + uVar3;
        ppiVar5 = (int **)local_b8._0_8_;
        do {
          iVar11 = 0x7fffffff;
          if (local_90 != (format_specs *)0x0) {
            if (ppiVar5 == (int **)(local_b8._8_8_ + local_b8._0_8_)) {
              uVar10 = (uint)(char)*(byte *)((long)(local_b8._8_8_ + local_b8._0_8_) + -1);
            }
            else {
              bVar7 = *(byte *)ppiVar5;
              if ((byte)(bVar7 + 0x81) < 0x82) goto LAB_003b3017;
              ppiVar5 = (int **)((long)ppiVar5 + 1);
              uVar10 = (uint)bVar7;
            }
            iVar6 = iVar6 + uVar10;
            iVar11 = iVar6;
          }
LAB_003b3017:
          sVar13 = sVar13 + 1;
        } while (iVar11 < (int)local_c4._8_4_);
        local_70._M_allocated_capacity = (size_type)(local_c4 + 4);
        local_70._8_8_ = local_c4;
        local_60 = &local_c8;
        local_58 = local_c4 + 8;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_ce;
        local_40._M_allocated_capacity = (size_type)local_cc;
        local_40._8_8_ = local_ce + 1;
        local_48 = (digit_grouping<char> *)local_b8;
        bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                          (out,specs,sVar13,sVar13,(anon_class_64_8_085c650e *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p,(ulong)(local_88._M_allocated_capacity + 1));
        }
        uVar4 = local_a8._M_allocated_capacity;
        uVar9 = local_b8._0_8_;
        if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
          return (basic_appender<char>)bVar2.container;
        }
      }
      else {
        lVar12 = uVar3 + uVar10;
        local_cc = (bool  [4])(iVar11 - local_c4._8_4_);
        if ((uVar1 >> 0xd & 1) != 0) {
          if (bVar7 != 2 && (int)local_cc < 1) {
            local_cc[0] = false;
            local_cc[1] = false;
            local_cc[2] = false;
            local_cc[3] = false;
          }
          lVar12 = lVar12 + 1;
          if (0 < (long)(int)local_cc) {
            lVar12 = lVar12 + (int)local_cc;
          }
        }
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
        sVar13 = lVar12 - 1;
        iVar11 = 0;
        uVar4 = local_70._0_8_;
        do {
          iVar6 = 0x7fffffff;
          if (local_48 != (digit_grouping<char> *)0x0) {
            if ((int **)uVar4 == (int **)(local_70._8_8_ + local_70._0_8_)) {
              uVar10 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._0_8_) + -1);
            }
            else {
              bVar7 = *(byte *)uVar4;
              if ((byte)(bVar7 + 0x81) < 0x82) goto LAB_003b2ef5;
              uVar4 = uVar4 + 1;
              uVar10 = (uint)bVar7;
            }
            iVar11 = iVar11 + uVar10;
            iVar6 = iVar11;
          }
LAB_003b2ef5:
          sVar13 = sVar13 + 1;
        } while (iVar6 < (int)local_c4._8_4_);
        local_b8._0_8_ = local_c4 + 4;
        local_b8._8_8_ = local_c4;
        local_a8._M_allocated_capacity = (size_type)&local_c8;
        local_88._M_allocated_capacity = (size_type)local_ce;
        local_88._8_8_ = local_cc;
        local_78 = local_ce + 1;
        local_a8._8_8_ = f;
        local_98._M_p = (pointer)&local_70;
        local_90 = specs;
        bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                          (out,specs,sVar13,sVar13,(anon_class_72_9_eb40e20e *)local_b8);
        if (local_50 != &local_40) {
          operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
        }
        uVar4 = local_60;
        uVar9 = local_70._0_8_;
        if ((int **)local_70._0_8_ == &local_60) {
          return (basic_appender<char>)bVar2.container;
        }
      }
      operator_delete((void *)uVar9,uVar4 + 1);
      return (basic_appender<char>)bVar2.container;
    }
    if (-4 < (int)local_c4._8_4_) {
      if (0 < iVar11) {
        exp_upper = iVar11;
      }
      if ((int)local_c4._8_4_ <= exp_upper) goto LAB_003b2d37;
    }
  }
  iVar6 = uVar10 + local_c8 + -1;
  if ((uVar1 >> 0xd & 1) == 0) {
    uVar8 = 0;
    if (local_c8 == 1) {
      local_ce[0] = '\0';
    }
  }
  else {
    uVar8 = 0;
    if (0 < iVar11 - local_c8) {
      uVar8 = (ulong)(uint)(iVar11 - local_c8);
    }
    uVar3 = uVar3 + uVar8;
  }
  iVar11 = 1 - local_c4._8_4_;
  if (0 < (int)local_c4._8_4_) {
    iVar11 = iVar6;
  }
  lVar12 = 2;
  if (99 < iVar11) {
    lVar12 = (ulong)(999 < iVar11) + 3;
  }
  sVar13 = (3 - (ulong)(local_ce[0] == '\0')) + lVar12 + uVar3;
  local_b8._4_4_ = local_c4._0_4_;
  local_b8._0_4_ = local_c4._4_4_;
  local_b8[0xc] = local_ce[0];
  local_b8._8_4_ = local_c8;
  local_a8._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar8);
  local_a8._M_allocated_capacity._6_2_ = SUB82(uVar4,6);
  local_a8._M_allocated_capacity =
       CONCAT26(local_a8._M_allocated_capacity._6_2_,
                CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,local_a8._M_allocated_capacity._0_5_)) |
       0x450000000000;
  local_a8._8_4_ = iVar6;
  if (specs->width < 1) {
    uVar3 = sVar13 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar3) {
      (*(out.container)->grow_)(out.container,uVar3);
    }
    bVar2 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_28_8_ce6b8c4d::operator()
                      ((anon_class_28_8_ce6b8c4d *)local_b8,out.container);
  }
  else {
    bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,sVar13,sVar13,(anon_class_28_8_ce6b8c4d *)local_b8);
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}